

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colormapper.h
# Opt level: O0

vector<float,_std::allocator<float>_> *
irwincolor::rgb2hsv(vector<float,_std::allocator<float>_> *__return_storage_ptr__,
                   vector<float,_std::allocator<float>_> *rgb)

{
  float fVar1;
  const_reference pvVar2;
  double *pdVar3;
  reference pvVar4;
  value_type vVar5;
  __type _Var6;
  float local_50;
  float local_4c;
  float hp;
  float c;
  double local_40;
  double local_38;
  float local_30;
  float m;
  allocator<float> local_1a;
  undefined1 local_19;
  vector<float,_std::allocator<float>_> *local_18;
  vector<float,_std::allocator<float>_> *rgb_local;
  vector<float,_std::allocator<float>_> *hsv;
  
  local_19 = 0;
  local_18 = rgb;
  rgb_local = __return_storage_ptr__;
  std::allocator<float>::allocator(&local_1a);
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,3,&local_1a);
  std::allocator<float>::~allocator(&local_1a);
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](local_18,0);
  local_38 = (double)*pvVar2;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](local_18,1);
  local_40 = (double)*pvVar2;
  pdVar3 = std::min<double>(&local_38,&local_40);
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](local_18,2);
  _hp = (double)*pvVar2;
  pdVar3 = std::min<double>(pdVar3,(double *)&hp);
  local_30 = (float)*pdVar3;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](local_18,0);
  fVar1 = *pvVar2;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](local_18,1);
  if (*pvVar2 <= fVar1 && fVar1 != *pvVar2) {
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](local_18,0);
    fVar1 = *pvVar2;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](local_18,2);
    if (*pvVar2 <= fVar1 && fVar1 != *pvVar2) {
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](local_18,0);
      local_4c = *pvVar2 - local_30;
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](local_18,0);
      vVar5 = *pvVar2;
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](__return_storage_ptr__,2);
      *pvVar4 = vVar5;
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](local_18,1);
      fVar1 = *pvVar2;
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](local_18,2);
      _Var6 = std::fmod<float,double>((fVar1 - *pvVar2) / local_4c,6.0);
      local_50 = (float)_Var6;
      goto LAB_001085f1;
    }
  }
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](local_18,1);
  fVar1 = *pvVar2;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](local_18,2);
  if (*pvVar2 <= fVar1 && fVar1 != *pvVar2) {
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](local_18,1);
    fVar1 = *pvVar2;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](local_18,0);
    if (*pvVar2 <= fVar1 && fVar1 != *pvVar2) {
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](local_18,1);
      local_4c = *pvVar2 - local_30;
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](local_18,1);
      vVar5 = *pvVar2;
      pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](__return_storage_ptr__,2);
      *pvVar4 = vVar5;
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](local_18,2);
      fVar1 = *pvVar2;
      pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](local_18,0);
      local_50 = (fVar1 - *pvVar2) / local_4c + 2.0;
      goto LAB_001085f1;
    }
  }
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](local_18,2);
  local_4c = *pvVar2 - local_30;
  pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](local_18,2);
  vVar5 = *pvVar2;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](__return_storage_ptr__,2);
  *pvVar4 = vVar5;
  if (0.0 < local_4c) {
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](local_18,0);
    fVar1 = *pvVar2;
    pvVar2 = std::vector<float,_std::allocator<float>_>::operator[](local_18,1);
    local_50 = (fVar1 - *pvVar2) / local_4c + 4.0;
  }
  else {
    local_50 = 0.0;
  }
LAB_001085f1:
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](__return_storage_ptr__,0);
  *pvVar4 = local_50 * 60.0;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](__return_storage_ptr__,2);
  if (0.0 < *pvVar4) {
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](__return_storage_ptr__,2);
    vVar5 = local_4c / *pvVar4;
  }
  else {
    vVar5 = 0.0;
  }
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](__return_storage_ptr__,1);
  *pvVar4 = vVar5;
  return __return_storage_ptr__;
}

Assistant:

std::vector<float> rgb2hsv(const std::vector<float>& rgb)
{
	std::vector<float> hsv(3);
	float m = std::min(std::min((double) rgb[0], (double) rgb[1]), (double) rgb[2]);
	float c, hp;
	if (rgb[0] > rgb[1] && rgb[0] > rgb[2])
	{
		c = rgb[0] - m;
		hsv[2] = rgb[0];
		hp = fmod((rgb[1] - rgb[2]) / c, 6.0);
	}
	else if (rgb[1] > rgb[2] && rgb[1] > rgb[0])
	{
		c = rgb[1] - m;
		hsv[2] = rgb[1];
		hp = (rgb[2] - rgb[0]) / c + 2.0;
	}
	else
	{
		c = rgb[2] - m;
		hsv[2] = rgb[2];
		hp = c <= 0.0 ? 0.0 : (rgb[0] - rgb[1]) / c + 4.0;
	}
	hsv[0] = hp * 60.0;
	hsv[1] = hsv[2] <= 0.0 ? 0.0 : c / hsv[2];
	return hsv;
}